

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O3

void Omega_h::binary::write_int_file(path *filepath,Mesh *mesh,I32 value)

{
  char cVar1;
  I32 IVar2;
  value_type *pvVar3;
  ostream *poVar4;
  ofstream file;
  char local_221;
  Comm *local_220;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_218 [30];
  ios_base local_128 [264];
  
  Omega_h::Mesh::comm(mesh);
  IVar2 = Comm::rank(local_220);
  if (local_218[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218[0]);
  }
  if (IVar2 == 0) {
    pvVar3 = filesystem::path::c_str(filepath);
    std::ofstream::ofstream(&local_220,pvVar3,_S_out);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      fail("assertion %s failed at %s +%d\n","file.is_open()",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
           ,0x1d6);
    }
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_220,value);
    local_221 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_221,1);
    local_220 = _VTT;
    *(undefined8 *)
     ((long)local_218 + (long)&_VTT[-1].host_dsts_.read_.write_.shared_alloc_.alloc[-1].next) =
         _sqrt;
    std::filebuf::~filebuf((filebuf *)local_218);
    std::ios_base::~ios_base(local_128);
  }
  return;
}

Assistant:

static void write_int_file(
    filesystem::path const& filepath, Mesh* mesh, I32 value) {
  if (mesh->comm()->rank() == 0) {
    std::ofstream file(filepath.c_str());
    OMEGA_H_CHECK(file.is_open());
    file << value << '\n';
  }
}